

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::ReportInvalidTestCaseType(char *test_case_name,CodeLocation *code_location)

{
  stringstream *this;
  size_t sVar1;
  ostream *poVar2;
  int line;
  char *pcVar3;
  GTestLog local_64;
  string local_60;
  string local_40;
  
  this = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this);
  poVar2 = (ostream *)(this + 0x10);
  *(undefined8 *)(this + *(long *)(*(long *)(this + 0x10) + -0x18) + 0x18) = 0x11;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"Attempted redefinition of test case ",0x24);
  if (test_case_name == (char *)0x0) {
    pcVar3 = "(null)";
    sVar1 = 6;
  }
  else {
    sVar1 = strlen(test_case_name);
    pcVar3 = test_case_name;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"All tests in the same test case must use the same test fixture\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"class.  However, in test case ",0x1e);
  if (test_case_name == (char *)0x0) {
    test_case_name = "(null)";
    sVar1 = 6;
  }
  else {
    sVar1 = strlen(test_case_name);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,test_case_name,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", you tried\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"to define a test using a fixture class different from the one\n",0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"used earlier. This can happen if the two fixture classes are\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"from different namespaces and have the same name. You should\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"probably rename one of the classes to put the tests into different\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"test cases.",0xb);
  line = 0xa1e;
  GTestLog::GTestLog(&local_64,GTEST_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/third_party/gtest/googletest/src/gtest.cc"
                     ,0xa1e);
  FormatFileLocation_abi_cxx11_
            (&local_40,(internal *)(code_location->file)._M_dataplus._M_p,
             (char *)(ulong)(uint)code_location->line,line);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  StringStreamToString(&local_60,(stringstream *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_60._M_dataplus._M_p,local_60._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  GTestLog::~GTestLog(&local_64);
  (**(code **)(*(long *)this + 8))(this);
  return;
}

Assistant:

void ReportInvalidTestCaseType(const char* test_case_name,
                               CodeLocation code_location) {
  Message errors;
  errors
      << "Attempted redefinition of test case " << test_case_name << ".\n"
      << "All tests in the same test case must use the same test fixture\n"
      << "class.  However, in test case " << test_case_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test cases.";

  GTEST_LOG_(ERROR) << FormatFileLocation(code_location.file.c_str(),
                                          code_location.line)
                    << " " << errors.GetString();
}